

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QRectF * __thiscall
QGraphicsItemPrivate::effectiveBoundingRect
          (QRectF *__return_storage_ptr__,QGraphicsItemPrivate *this,
          QGraphicsItem *topMostEffectItem)

{
  QGraphicsItem *this_00;
  QGraphicsItem *item;
  QGraphicsEffect *this_01;
  ulong uVar1;
  bool bVar2;
  QGraphicsItemPrivate *pQVar3;
  long in_FS_OFFSET;
  QRectF local_98;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->q_ptr;
  *(undefined4 *)&__return_storage_ptr__->w = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->h = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->xp = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->yp = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = 0xffffffff;
  (*this_00->_vptr_QGraphicsItem[3])(&local_58,this_00);
  effectiveBoundingRect(__return_storage_ptr__,this,&local_58);
  if ((this_00 != topMostEffectItem) &&
     (pQVar3 = this, (*(ulong *)&this->field_0x160 & 0x120000) == 0)) {
    while (item = pQVar3->parent, item != (QGraphicsItem *)0x0) {
      if (((this->scene != (QGraphicsScene *)0x0) &&
          (this_01 = ((item->d_ptr).d)->graphicsEffect, this_01 != (QGraphicsEffect *)0x0)) &&
         (bVar2 = QGraphicsEffect::isEnabled(this_01), bVar2)) {
        local_58.w._0_4_ = 0xffffffff;
        local_58.w._4_4_ = 0xffffffff;
        local_58.h._0_4_ = 0xffffffff;
        local_58.h._4_4_ = 0xffffffff;
        local_58.xp._0_4_ = 0xffffffff;
        local_58.xp._4_4_ = 0xffffffff;
        local_58.yp._0_4_ = 0xffffffff;
        local_58.yp._4_4_ = 0xffffffff;
        QGraphicsItem::mapRectToItem(&local_58,this_00,item,__return_storage_ptr__);
        local_78.w._0_4_ = 0xffffffff;
        local_78.w._4_4_ = 0xffffffff;
        local_78.h._0_4_ = 0xffffffff;
        local_78.h._4_4_ = 0xffffffff;
        local_78.xp._0_4_ = 0xffffffff;
        local_78.xp._4_4_ = 0xffffffff;
        local_78.yp._0_4_ = 0xffffffff;
        local_78.yp._4_4_ = 0xffffffff;
        effectiveBoundingRect(&local_78,(item->d_ptr).d,&local_58);
        QGraphicsItem::mapRectToItem(&local_98,item,this_00,&local_78);
        __return_storage_ptr__->w = local_98.w;
        __return_storage_ptr__->h = local_98.h;
        __return_storage_ptr__->xp = local_98.xp;
        __return_storage_ptr__->yp = local_98.yp;
      }
      pQVar3 = (item->d_ptr).d;
      uVar1 = *(ulong *)&pQVar3->field_0x160;
      if (((((uint)uVar1 >> 0x11 & 1) != 0) || (item == topMostEffectItem)) ||
         ((uVar1 & 0x100000) != 0)) break;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QGraphicsItemPrivate::effectiveBoundingRect(QGraphicsItem *topMostEffectItem) const
{
#if QT_CONFIG(graphicseffect)
    Q_Q(const QGraphicsItem);
    QRectF brect = effectiveBoundingRect(q_ptr->boundingRect());
    if (ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
        || ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren
        || topMostEffectItem == q)
        return brect;

    const QGraphicsItem *effectParent = parent;
    while (effectParent) {
        QGraphicsEffect *effect = effectParent->d_ptr->graphicsEffect;
        if (scene && effect && effect->isEnabled()) {
            const QRectF brectInParentSpace = q->mapRectToItem(effectParent, brect);
            const QRectF effectRectInParentSpace = effectParent->d_ptr->effectiveBoundingRect(brectInParentSpace);
            brect = effectParent->mapRectToItem(q, effectRectInParentSpace);
        }
        if (effectParent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
            || effectParent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren
            || topMostEffectItem == effectParent) {
            return brect;
        }
        effectParent = effectParent->d_ptr->parent;
    }

    return brect;
#else //QT_CONFIG(graphicseffect)
    Q_UNUSED(topMostEffectItem);
    return q_ptr->boundingRect();
#endif // QT_CONFIG(graphicseffect)

}